

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unsetJoinExpr(Expr *p,int iTable,int nullable)

{
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int i;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  char *local_8;
  
  for (local_8 = in_RDI; local_8 != (char *)0x0; local_8 = *(char **)(local_8 + 0x18)) {
    if (((in_ESI < 0) ||
        (((*(uint *)(local_8 + 4) & 1) != 0 && (*(int *)(local_8 + 0x34) == in_ESI)))) &&
       (*(uint *)(local_8 + 4) = *(uint *)(local_8 + 4) & 0xfffffffc, -1 < in_ESI)) {
      *(uint *)(local_8 + 4) = *(uint *)(local_8 + 4) | 2;
    }
    if (((*local_8 == -0x58) && (*(int *)(local_8 + 0x2c) == in_ESI)) && (in_EDX == 0)) {
      *(uint *)(local_8 + 4) = *(uint *)(local_8 + 4) & 0xffdfffff;
    }
    if ((*local_8 == -0x54) && (*(long *)(local_8 + 0x20) != 0)) {
      for (in_stack_ffffffffffffffec = 0; in_stack_ffffffffffffffec < **(int **)(local_8 + 0x20);
          in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1) {
        unsetJoinExpr((Expr *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                      in_stack_ffffffffffffffe8);
      }
    }
    unsetJoinExpr((Expr *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                  in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable, int nullable){
  while( p ){
    if( iTable<0 || (ExprHasProperty(p, EP_OuterON) && p->w.iJoin==iTable) ){
      ExprClearProperty(p, EP_OuterON|EP_InnerON);
      if( iTable>=0 ) ExprSetProperty(p, EP_InnerON);
    }
    if( p->op==TK_COLUMN && p->iTable==iTable && !nullable ){
      ExprClearProperty(p, EP_CanBeNull);
    }
    if( p->op==TK_FUNCTION ){
      assert( ExprUseXList(p) );
      assert( p->pLeft==0 );
      if( p->x.pList ){
        int i;
        for(i=0; i<p->x.pList->nExpr; i++){
          unsetJoinExpr(p->x.pList->a[i].pExpr, iTable, nullable);
        }
      }
    }
    unsetJoinExpr(p->pLeft, iTable, nullable);
    p = p->pRight;
  }
}